

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O2

Regexp * re2::SimplifyWalker::SimplifyCharClass(Regexp *re)

{
  CharClass *pCVar1;
  Regexp *pRVar2;
  
  pCVar1 = Regexp::cc(re);
  if (*(int *)(pCVar1 + 4) == 0x110000) {
    pRVar2 = (Regexp *)operator_new(0x28);
    Regexp::Regexp(pRVar2,kRegexpAnyChar,(uint)re->parse_flags_);
  }
  else {
    if (*(int *)(pCVar1 + 4) != 0) {
      pRVar2 = Regexp::Incref(re);
      return pRVar2;
    }
    pRVar2 = (Regexp *)operator_new(0x28);
    Regexp::Regexp(pRVar2,kRegexpNoMatch,(uint)re->parse_flags_);
  }
  return pRVar2;
}

Assistant:

Regexp* SimplifyWalker::SimplifyCharClass(Regexp* re) {
  CharClass* cc = re->cc();

  // Special cases
  if (cc->empty())
    return new Regexp(kRegexpNoMatch, re->parse_flags());
  if (cc->full())
    return new Regexp(kRegexpAnyChar, re->parse_flags());

  return re->Incref();
}